

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  pointer pcVar1;
  pointer pcVar2;
  int *piVar3;
  bool bVar4;
  cmGraphEdge *edge;
  pointer pcVar5;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar6;
  int j;
  bool local_4d;
  int local_4c;
  cmListFileBacktrace local_48;
  int *local_38;
  
  local_4c = i;
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     visited,&local_4c);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00375dfd:
    bVar4 = false;
  }
  else {
    pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       emitted,&local_4c);
    bVar4 = true;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar1 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = *(pointer *)
                ((long)&pcVar1[local_4c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      local_38 = head;
      for (pcVar5 = *(pointer *)
                     &pcVar1[local_4c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          piVar3 = local_38, pcVar5 != pcVar2; pcVar5 = pcVar5 + 1) {
        local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(local_48.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,pcVar5->Dest);
        if (((cmap->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[pcVar5->Dest] == c) && (pcVar5->Strong == true)) {
          local_4d = true;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((this->FinalGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + local_4c),(int *)&local_48,&local_4d,
                     &pcVar5->Backtrace);
          bVar4 = IntraComponent(this,cmap,c,
                                 (int)local_48.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,local_38,emitted,visited);
          if (!bVar4) goto LAB_00375dfd;
        }
      }
      if (*local_38 < 0) {
        (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[c] = local_4c;
      }
      else {
        local_4d = false;
        local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int&,bool,cmListFileBacktrace>
                  ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   ((this->FinalGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start + local_4c),local_38,&local_4d,&local_48);
        if (local_48.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      *piVar3 = local_4c;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (cmGraphEdge const& edge : el) {
      int j = edge;
      if (cmap[j] == c && edge.IsStrong()) {
        this->FinalGraph[i].emplace_back(j, true, edge.GetBacktrace());
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].emplace_back(*head, false, cmListFileBacktrace());
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}